

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O1

void __thiscall DSDcc::DSDDstar::DSDDstar(DSDDstar *this,DSDDecoder *dsdDecoder)

{
  this->m_dsdDecoder = dsdDecoder;
  this->m_voiceFrameCount = 0;
  this->m_frameType = DStarVoiceFrame;
  this->m_symbolIndex = 0;
  this->m_symbolIndexHD = 0;
  Viterbi3::Viterbi3(&this->m_viterbi,2,(uint *)&Viterbi::Poly23a,false);
  DStarCRC::DStarCRC(&this->m_crcDStar);
  CRC::CRC(&this->m_crc,0x8408,0x10,0xffff,0xffff,1,0,0);
  this->slowdataIx = 0;
  this->w = (int *)0x0;
  this->x = (int *)0x0;
  (this->m_header).m_rpt1._M_dataplus._M_p = (pointer)&(this->m_header).m_rpt1.field_2;
  (this->m_header).m_rpt1._M_string_length = 0;
  (this->m_header).m_rpt1.field_2._M_local_buf[0] = '\0';
  (this->m_header).m_rpt2._M_dataplus._M_p = (pointer)&(this->m_header).m_rpt2.field_2;
  (this->m_header).m_rpt2._M_string_length = 0;
  (this->m_header).m_rpt2.field_2._M_local_buf[0] = '\0';
  (this->m_header).m_yourSign._M_dataplus._M_p = (pointer)&(this->m_header).m_yourSign.field_2;
  (this->m_header).m_yourSign._M_string_length = 0;
  (this->m_header).m_yourSign.field_2._M_local_buf[0] = '\0';
  (this->m_header).m_mySign._M_dataplus._M_p = (pointer)&(this->m_header).m_mySign.field_2;
  (this->m_header).m_mySign._M_string_length = 0;
  (this->m_header).m_mySign.field_2._M_local_buf[0] = '\0';
  (this->m_dprs).m_lon = 0.0;
  (this->m_dprs).m_lat = 0.0;
  Locator::Locator(&(this->m_dprs).m_locPoint.m_locator);
  reset_header_strings(this);
  (this->m_slowData).radioHeaderIndex = 0;
  (this->m_slowData).textFrameIndex = 0;
  (this->m_slowData).counter = 0;
  (this->m_slowData).radioHeader[0] = '\0';
  (this->m_slowData).radioHeader[1] = '\0';
  (this->m_slowData).radioHeader[2] = '\0';
  (this->m_slowData).radioHeader[3] = '\0';
  (this->m_slowData).radioHeader[4] = '\0';
  (this->m_slowData).radioHeader[5] = '\0';
  (this->m_slowData).radioHeader[6] = '\0';
  (this->m_slowData).radioHeader[7] = '\0';
  (this->m_slowData).radioHeader[8] = '\0';
  (this->m_slowData).radioHeader[9] = '\0';
  (this->m_slowData).radioHeader[10] = '\0';
  (this->m_slowData).radioHeader[0xb] = '\0';
  (this->m_slowData).radioHeader[0xc] = '\0';
  (this->m_slowData).radioHeader[0xd] = '\0';
  (this->m_slowData).radioHeader[0xe] = '\0';
  (this->m_slowData).radioHeader[0xf] = '\0';
  (this->m_slowData).radioHeader[0x10] = '\0';
  (this->m_slowData).radioHeader[0x11] = '\0';
  (this->m_slowData).radioHeader[0x12] = '\0';
  (this->m_slowData).radioHeader[0x13] = '\0';
  (this->m_slowData).radioHeader[0x14] = '\0';
  (this->m_slowData).radioHeader[0x15] = '\0';
  (this->m_slowData).radioHeader[0x16] = '\0';
  (this->m_slowData).radioHeader[0x17] = '\0';
  (this->m_slowData).radioHeader[0x18] = '\0';
  (this->m_slowData).radioHeader[0x19] = '\0';
  (this->m_slowData).radioHeader[0x1a] = '\0';
  (this->m_slowData).radioHeader[0x1b] = '\0';
  (this->m_slowData).radioHeader[0x19] = '\0';
  (this->m_slowData).radioHeader[0x1a] = '\0';
  (this->m_slowData).radioHeader[0x1b] = '\0';
  (this->m_slowData).radioHeader[0x1c] = '\0';
  (this->m_slowData).radioHeader[0x1d] = '\0';
  (this->m_slowData).radioHeader[0x1e] = '\0';
  (this->m_slowData).radioHeader[0x1f] = '\0';
  (this->m_slowData).radioHeader[0x20] = '\0';
  (this->m_slowData).radioHeader[0x21] = '\0';
  (this->m_slowData).radioHeader[0x22] = '\0';
  (this->m_slowData).radioHeader[0x23] = '\0';
  (this->m_slowData).radioHeader[0x24] = '\0';
  (this->m_slowData).radioHeader[0x25] = '\0';
  (this->m_slowData).radioHeader[0x26] = '\0';
  (this->m_slowData).radioHeader[0x27] = '\0';
  (this->m_slowData).radioHeader[0x28] = '\0';
  builtin_strncpy((this->m_slowData).text,"                    ",0x15);
  memset((this->m_slowData).gpsNMEA,0,0x104);
  (this->m_slowData).gpsStart = true;
  (this->m_slowData).locator[0] = ' ';
  (this->m_slowData).locator[1] = ' ';
  (this->m_slowData).locator[2] = ' ';
  (this->m_slowData).locator[3] = ' ';
  (this->m_slowData).locator[4] = ' ';
  (this->m_slowData).locator[5] = ' ';
  *(undefined8 *)((this->m_slowData).locator + 6) = 0;
  *(undefined1 *)((long)&(this->m_slowData).distance + 3) = 0;
  (this->m_slowData).currentDataType = DStarSlowDataNone;
  this->nullBytes[0] = '\0';
  this->nullBytes[1] = '\0';
  this->nullBytes[2] = '\0';
  this->nullBytes[3] = '\0';
  this->slowdata[0] = '\0';
  this->slowdata[1] = '\0';
  this->slowdata[2] = '\0';
  this->slowdata[3] = '\0';
  return;
}

Assistant:

DSDDstar::DSDDstar(DSDDecoder *dsdDecoder) :
		m_dsdDecoder(dsdDecoder),
		m_voiceFrameCount(0),
		m_frameType(DStarVoiceFrame),
		m_symbolIndex(0),
		m_symbolIndexHD(0),
        m_viterbi(2, Viterbi::Poly23a, false),
        m_crc(CRC::PolyDStar16, 16, 0xffff, 0xffff, 1, 0, 0),
		slowdataIx(0),
		w(0),
		x(0)
{
    reset_header_strings();
    m_slowData.init();
    memset(nullBytes, 0, 4);
    memset(slowdata, 0, 4);
}